

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O2

KBOOL __thiscall KDIS::PDU::TSPI_PDU::operator==(TSPI_PDU *this,TSPI_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  KFIXED<short,_(unsigned_char)__x03_> local_28;
  
  KVar1 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if (((((!KVar1) && ((this->m_TSPIFlagUnion).m_ui8Flag == (Value->m_TSPIFlagUnion).m_ui8Flag)) &&
       (KVar1 = DATA_TYPE::RelativeWorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc), !KVar1)
       ) && ((KVar1 = DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::
                      operator!=(&this->m_LinVel,&Value->m_LinVel), !KVar1 &&
             (KVar1 = DATA_TYPE::LE_EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar1))))
     && ((KVar1 = DATA_TYPE::PositionError::operator!=(&this->m_PosErr,&Value->m_PosErr), !KVar1 &&
         ((KVar1 = DATA_TYPE::OrientationError::operator!=(&this->m_OriErr,&Value->m_OriErr), !KVar1
          && (KVar1 = DATA_TYPE::LE_DeadReckoningParameter::operator!=
                                (&this->m_DeadReckoningParameter,&Value->m_DeadReckoningParameter),
             !KVar1)))))) {
    local_28.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00214438;
    local_28.m_Val = (Value->m_MeasureSpd).m_Val;
    KVar1 = DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::operator!=
                      (&this->m_MeasureSpd,&local_28);
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_28.super_DataTypeBase);
    if ((!KVar1) && (this->m_ui8SSDLen == Value->m_ui8SSDLen)) {
      bVar2 = std::operator!=(&this->m_vSSD,&Value->m_vSSD);
      return !bVar2;
    }
  }
  return false;
}

Assistant:

KBOOL TSPI_PDU::operator == ( const TSPI_PDU & Value ) const
{
    if( LE_Header::operator       != ( Value ) )                       return false;
    if( m_TSPIFlagUnion.m_ui8Flag != Value.m_TSPIFlagUnion.m_ui8Flag ) return false;
    if( m_Loc                     != Value.m_Loc )                     return false;
    if( m_LinVel                  != Value.m_LinVel )                  return false;
    if( m_Ori                     != Value.m_Ori )                     return false;
    if( m_PosErr                  != Value.m_PosErr )                  return false;
    if( m_OriErr                  != Value.m_OriErr )                  return false;
    if( m_DeadReckoningParameter  != Value.m_DeadReckoningParameter )  return false;
    if( m_MeasureSpd              != Value.m_MeasureSpd )              return false;
    if( m_ui8SSDLen               != Value.m_ui8SSDLen )               return false;
    if( m_vSSD                    != Value.m_vSSD )                    return false;
    return true;
}